

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void GdlRuleItem::GenerateInsertEqualsFalse
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput)

{
  uchar local_c [4];
  
  local_c[3] = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,local_c + 3);
  local_c[2] = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,local_c + 2);
  local_c[1] = 0x23;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,local_c + 1);
  local_c[0] = '\x11';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,local_c);
  return;
}

Assistant:

void GdlRuleItem::GenerateInsertEqualsFalse(std::vector<gr::byte> & vbOutput)
{
	vbOutput.push_back(kopPushByte);
	vbOutput.push_back(0);	// false;
	vbOutput.push_back(kopAttrSet);
	vbOutput.push_back(kslatInsert);
}